

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void rbuCopyPragma(sqlite3rbu *p,char *zPragma)

{
  sqlite3 *psVar1;
  sqlite3_stmt *pStmt;
  int iVar2;
  char *zSql;
  Mem *pMem;
  ulong uVar3;
  sqlite3_stmt *pPragma;
  sqlite3_stmt *local_30;
  
  if (p->rc != 0) {
    return;
  }
  local_30 = (sqlite3_stmt *)0x0;
  psVar1 = p->dbRbu;
  zSql = sqlite3_mprintf("PRAGMA main.%s");
  iVar2 = prepareFreeAndCollectError(psVar1,&local_30,&p->zErrmsg,zSql);
  pStmt = local_30;
  p->rc = iVar2;
  if (iVar2 == 0) {
    iVar2 = sqlite3_step(local_30);
    if (iVar2 == 100) {
      psVar1 = p->dbMain;
      pMem = columnMem(pStmt,0);
      uVar3 = sqlite3VdbeIntValue(pMem);
      columnMallocFailure(pStmt);
      iVar2 = rbuMPrintfExec(p,psVar1,"PRAGMA main.%s = %d",zPragma,uVar3 & 0xffffffff);
      p->rc = iVar2;
    }
  }
  rbuFinalize(p,pStmt);
  return;
}

Assistant:

static void rbuCopyPragma(sqlite3rbu *p, const char *zPragma){
  if( p->rc==SQLITE_OK ){
    sqlite3_stmt *pPragma = 0;
    p->rc = prepareFreeAndCollectError(p->dbRbu, &pPragma, &p->zErrmsg, 
        sqlite3_mprintf("PRAGMA main.%s", zPragma)
    );
    if( p->rc==SQLITE_OK && SQLITE_ROW==sqlite3_step(pPragma) ){
      p->rc = rbuMPrintfExec(p, p->dbMain, "PRAGMA main.%s = %d",
          zPragma, sqlite3_column_int(pPragma, 0)
      );
    }
    rbuFinalize(p, pPragma);
  }
}